

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O1

void test_parse_errors(void)

{
  int status_code;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
  *p_Var1;
  _func_cio_error_cio_buffered_stream_ptr_cio_write_buffer_ptr_cio_buffered_stream_write_handler_t_void_ptr
  *p_Var2;
  char *request;
  cio_error cVar3;
  cio_inet_address *arg1;
  long lVar4;
  cio_http_server_configuration config;
  cio_http_server server;
  cio_http_server_configuration cStack_238;
  cio_http_server local_180;
  
  lVar4 = 0x18;
  do {
    p_Var1 = *(_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
               **)((long)&test_errors_in_accept::accept_tests[7].buffered_stream_init_return_val +
                  lVar4);
    p_Var2 = *(_func_cio_error_cio_buffered_stream_ptr_cio_write_buffer_ptr_cio_buffered_stream_write_handler_t_void_ptr
               **)((long)&test_errors_in_accept::accept_tests[7].accept_handler + lVar4);
    request = *(char **)((long)&test_errors_in_accept::accept_tests[7].request + lVar4);
    status_code = *(int *)((long)&test_parse_errors::parse_tests[0].read_until + lVar4);
    memcpy(&cStack_238,&DAT_001199e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&cStack_238.endpoint,arg1,0x1f90);
    cio_buffered_stream_read_until_fake.custom_fake = p_Var1;
    cio_buffered_stream_write_fake.custom_fake = p_Var2;
    cVar3 = cio_http_server_init(&local_180,&loop,&cStack_238);
    UnityAssertEqualNumber
              (0,(long)cVar3,"Server initialization failed!",0x70e,UNITY_DISPLAY_STYLE_INT);
    split_request(request);
    cVar3 = cio_http_server_serve(&local_180);
    UnityAssertEqualNumber(0,(long)cVar3,"Serving http failed!",0x713,UNITY_DISPLAY_STYLE_INT);
    check_http_response(status_code);
    if (status_code == 500) {
      UnityAssertEqualNumber
                (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x718,
                 UNITY_DISPLAY_STYLE_INT);
    }
    setUp();
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xb8);
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_parse_errors(void)
{
	struct parse_test {
		enum cio_error (*read_until)(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, const char *delim, cio_buffered_stream_read_handler_t handler, void *handler_context);
		enum cio_error (*write_all)(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buf, cio_buffered_stream_write_handler_t handler, void *handler_context);
		const char *request;
		int expected_response;
	};

	static struct parse_test parse_tests[] = {
	    {.read_until = bs_read_until_error_in_callback, .write_all = bs_write_all, .request = "GET /foo HTTP/1.1" CRLF CRLF, .expected_response = 500},
	    {.read_until = bs_read_until_ok, .write_all = bs_write_all, .request = "GT /foo HTTP/1.1" CRLF CRLF, .expected_response = 400},
	    {.read_until = bs_read_until_ok, .write_all = bs_write_error, .request = "GT /foo HTTP/1.1" CRLF CRLF},
	    {.read_until = bs_read_until_ok, .write_all = bs_write_all, .request = "GET http://ww%.google.de/ HTTP/1.1" CRLF CRLF, .expected_response = 400},
	    {.read_until = bs_read_until_ok, .write_all = bs_write_all, .request = "CONNECT www.google.de:80 HTTP/1.1" CRLF CRLF, .expected_response = 400},
	};

	for (unsigned int i = 0; i < ARRAY_SIZE(parse_tests); i++) {
		struct parse_test parse_test = parse_tests[i];

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		cio_buffered_stream_read_until_fake.custom_fake = parse_test.read_until;
		cio_buffered_stream_write_fake.custom_fake = parse_test.write_all;

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		split_request(parse_test.request);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		check_http_response(parse_test.expected_response);

		if (parse_test.expected_response == 500) {
			TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");
		}

		setUp();
	}

	free_dummy_client(client_socket);
}